

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::connectDestroyed(TcpConnection *this)

{
  pointer pCVar1;
  enable_shared_from_this<sznet::net::TcpConnection> *in_RSI;
  enable_shared_from_this<sznet::net::TcpConnection> local_20;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnected) {
    setState(this,kDisconnected);
    pCVar1 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_channel);
    Channel::disableAll(pCVar1);
    in_RSI = &local_20;
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(in_RSI);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
              (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)in_RSI);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)&local_20);
  }
  pCVar1 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  Channel::remove(pCVar1,(char *)in_RSI);
  return;
}

Assistant:

void TcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_channel->disableAll();

		m_connectionCallback(shared_from_this());
	}
	m_channel->remove();
}